

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEDDSA.cpp
# Opt level: O0

bool __thiscall
OSSLEDDSA::deriveKey
          (OSSLEDDSA *this,SymmetricKey **ppSymmetricKey,PublicKey *publicKey,PrivateKey *privateKey
          )

{
  EVP_PKEY_CTX *ctx_00;
  byte bVar1;
  int iVar2;
  uchar *key;
  void *pvVar3;
  SymmetricKey *this_00;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  ByteString secret;
  size_t len;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY *priv;
  EVP_PKEY *pub;
  size_t in_stack_ffffffffffffff38;
  OSSLEDPrivateKey *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined1 local_70 [40];
  size_t local_48;
  EVP_PKEY_CTX *local_40;
  EVP_PKEY *local_38;
  EVP_PKEY *local_30;
  long *local_18;
  byte local_1;
  
  if (((in_RSI == (long *)0x0) || (in_RDX == 0)) || (in_RCX == 0)) {
    local_1 = 0;
  }
  else {
    local_18 = in_RSI;
    local_30 = (EVP_PKEY *)OSSLEDPublicKey::getOSSLKey((OSSLEDPublicKey *)in_stack_ffffffffffffff40)
    ;
    local_38 = (EVP_PKEY *)OSSLEDPrivateKey::getOSSLKey(in_stack_ffffffffffffff40);
    if ((local_30 == (EVP_PKEY *)0x0) || (local_38 == (EVP_PKEY *)0x0)) {
      softHSMLog(3,"deriveKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                 ,0x12d,"Failed to get OpenSSL ECDH keys");
      local_1 = 0;
    }
    else {
      local_40 = EVP_PKEY_CTX_new(local_38,(ENGINE *)0x0);
      if (local_40 == (EVP_PKEY_CTX *)0x0) {
        softHSMLog(3,"deriveKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                   ,0x136,"Failed to get OpenSSL ECDH context");
        local_1 = 0;
      }
      else {
        iVar2 = EVP_PKEY_derive_init(local_40);
        if (iVar2 < 1) {
          softHSMLog(3,"deriveKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                     ,0x13c,"Failed to init OpenSSL key derive");
          EVP_PKEY_CTX_free(local_40);
          local_1 = 0;
        }
        else {
          iVar2 = EVP_PKEY_derive_set_peer(local_40,local_30);
          if (iVar2 < 1) {
            softHSMLog(3,"deriveKey",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                       ,0x143,"Failed to set OpenSSL ECDH public key");
            EVP_PKEY_CTX_free(local_40);
            local_1 = 0;
          }
          else {
            iVar2 = EVP_PKEY_derive(local_40,(uchar *)0x0,&local_48);
            if (iVar2 < 1) {
              softHSMLog(3,"deriveKey",
                         "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                         ,0x14d,"Failed to get OpenSSL ECDH key length");
              EVP_PKEY_CTX_free(local_40);
              local_1 = 0;
            }
            else {
              ByteString::ByteString((ByteString *)0x12e5d8);
              ByteString::resize((ByteString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              ctx_00 = local_40;
              key = ByteString::operator[]
                              ((ByteString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              iVar2 = EVP_PKEY_derive(ctx_00,key,&local_48);
              if (iVar2 < 1) {
                softHSMLog(3,"deriveKey",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEDDSA.cpp"
                           ,0x156,"Failed to derive OpenSSL ECDH secret");
                EVP_PKEY_CTX_free(local_40);
                local_1 = 0;
              }
              else {
                EVP_PKEY_CTX_free(local_40);
                pvVar3 = operator_new(0x38);
                this_00 = (SymmetricKey *)ByteString::size((ByteString *)0x12e6bd);
                SymmetricKey::SymmetricKey
                          (this_00,CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
                *local_18 = (long)pvVar3;
                if (*local_18 == 0) {
                  local_1 = 0;
                }
                else {
                  bVar1 = (**(code **)(*(long *)*local_18 + 0x18))((long *)*local_18,local_70);
                  if ((bVar1 & 1) == 0) {
                    if ((long *)*local_18 != (long *)0x0) {
                      (**(code **)(*(long *)*local_18 + 0x10))();
                    }
                    *local_18 = 0;
                    local_1 = 0;
                  }
                  else {
                    local_1 = 1;
                  }
                }
              }
              ByteString::~ByteString((ByteString *)0x12e7ae);
            }
          }
        }
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEDDSA::deriveKey(SymmetricKey **ppSymmetricKey, PublicKey* publicKey, PrivateKey* privateKey)
{
	// Check parameters
	if ((ppSymmetricKey == NULL) ||
	    (publicKey == NULL) ||
	    (privateKey == NULL))
	{
		return false;
	}

	// Get keys
	EVP_PKEY *pub = ((OSSLEDPublicKey *)publicKey)->getOSSLKey();
	EVP_PKEY *priv = ((OSSLEDPrivateKey *)privateKey)->getOSSLKey();
	if (pub == NULL || priv == NULL)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH keys");

		return false;
	}

	// Get and set context
	EVP_PKEY_CTX *ctx = EVP_PKEY_CTX_new(priv, NULL);
	if (ctx == NULL)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH context");

		return false;
	}
	if (EVP_PKEY_derive_init(ctx) <= 0)
	{
		ERROR_MSG("Failed to init OpenSSL key derive");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	if (EVP_PKEY_derive_set_peer(ctx, pub) <= 0)
	{
		ERROR_MSG("Failed to set OpenSSL ECDH public key");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}

	// Derive the secret
	size_t len;
	if (EVP_PKEY_derive(ctx, NULL, &len) <= 0)
	{
		ERROR_MSG("Failed to get OpenSSL ECDH key length");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	ByteString secret;
	secret.resize(len);
	if (EVP_PKEY_derive(ctx, &secret[0], &len) <= 0)
	{
		ERROR_MSG("Failed to derive OpenSSL ECDH secret");

		EVP_PKEY_CTX_free(ctx);
		return false;
	}
	EVP_PKEY_CTX_free(ctx);

	// Create derived key
	*ppSymmetricKey = new SymmetricKey(secret.size() * 8);
	if (*ppSymmetricKey == NULL)
		return false;
	if (!(*ppSymmetricKey)->setKeyBits(secret))
	{
		delete *ppSymmetricKey;
		*ppSymmetricKey = NULL;
		return false;
	}

	return true;
}